

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::checkExampleValue
               (Reader *value,uint ordinal,Reader type,uint sharedOrdinalCount)

{
  double dVar1;
  Reader type_00;
  Reader type_01;
  Field field;
  Field field_00;
  ReaderFor<bool> RVar2;
  int8_t iVar3;
  bool bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  uint sharedOrdinalCount_01;
  uint sharedOrdinalCount_00;
  StringPtr name;
  StringPtr name_00;
  ReaderFor<Text> RVar8;
  ReaderFor<DynamicEnum> RVar9;
  Fault f;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_268;
  uint ordinal_local;
  StructSchema structType;
  Reader local_218;
  undefined7 uStack_1e8;
  Reader local_180;
  Reader local_150;
  ReaderFor<capnp::DynamicStruct> structValue;
  Reader local_e8;
  Reader local_a0;
  Reader local_58;
  
  ordinal_local = ordinal;
  if (type._reader.dataSize < 0x10) {
switchD_0016ca44_caseD_3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x226,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal(&f);
  }
  switch(*type._reader.data) {
  case 1:
    RVar2 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    if (RVar2 == (ReaderFor<bool>)((byte)ordinal & 1)) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x20a,FAILED,"value.as<bool>() == (ordinal % 2 == 0)","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 2:
    iVar3 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(value);
    if ((ordinal & 0xff) - 0x80 != (int)iVar3) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x208,FAILED,"value.as<int8_t>() == int(ordinal % 256) - 128","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  default:
    goto switchD_0016ca44_caseD_3;
  case 4:
    iVar7 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(value);
    if (iVar7 != ordinal * 0xb8df) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x206,FAILED,"value.as<int32_t>() == ordinal * 47327","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 7:
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(value);
    if (ordinal * 0xd != (uint)uVar5) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x209,FAILED,"value.as<uint16_t>() == ordinal * 13","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 0xb:
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
    if ((dVar1 != (double)ordinal * 313.25) || (NAN(dVar1) || NAN((double)ordinal * 313.25))) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x207,FAILED,"value.as<double>() == ordinal * 313.25","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 0xc:
    RVar8 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    local_218._reader.segment._0_7_ = RVar8.super_StringPtr.content.ptr._0_7_;
    local_218._reader.segment._7_1_ = RVar8.super_StringPtr.content.ptr._7_1_;
    local_218._reader.capTable._0_2_ = (uint16_t)RVar8.super_StringPtr.content.size_;
    local_218._reader.capTable._2_5_ = RVar8.super_StringPtr.content.size_._2_5_;
    local_218._reader.capTable._7_1_ = RVar8.super_StringPtr.content.size_._7_1_;
    kj::str<unsigned_int&>((String *)&f,(kj *)&ordinal_local,RVar8.super_StringPtr.content.size_);
    if (aStack_268._0_8_ == (Schema)0x0) {
      structValue.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x1ebdf1;
    }
    else {
      structValue.schema.super_Schema.raw = (Schema)CONCAT71(f.exception._1_7_,(char)f.exception);
    }
    structValue.reader.segment =
         (SegmentReader *)
         (aStack_268.textValue.super_StringPtr.content.ptr + (aStack_268._0_8_ == (Schema)0x0));
    bVar4 = kj::StringPtr::operator==((StringPtr *)&local_218,(StringPtr *)&structValue);
    kj::Array<char>::~Array((Array<char> *)&f);
    if (!bVar4) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x20b,FAILED,"value.as<Text>() == kj::str(ordinal)","");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 0xe:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&f,value);
    DynamicList::Reader::operator[](&local_e8,(ReaderFor<DynamicList> *)&f,0);
    local_218._reader._32_7_ = type._reader._32_7_;
    local_218._reader._39_1_ = type._reader._39_1_;
    local_218._reader._40_7_ = type._reader._40_7_;
    local_218._reader._47_1_ = type._reader._47_1_;
    local_218._reader.data._0_7_ = type._reader.data._0_7_;
    local_218._reader.data._7_1_ = type._reader.data._7_1_;
    local_218._reader.pointers._0_7_ = type._reader.pointers._0_7_;
    local_218._reader.pointers._7_1_ = type._reader.pointers._7_1_;
    local_218._reader.segment._0_7_ = type._reader.segment._0_7_;
    local_218._reader.segment._7_1_ = type._reader.segment._7_1_;
    local_218._reader.capTable._0_2_ = (uint16_t)type._reader.capTable;
    local_218._reader.capTable._2_5_ = type._reader.capTable._2_5_;
    local_218._reader.capTable._7_1_ = type._reader.capTable._7_1_;
    capnp::schema::Type::List::Reader::getElementType(&local_180,&local_218);
    type_00._reader.capTable = local_180._reader.capTable;
    type_00._reader.segment = local_180._reader.segment;
    type_00._reader.data = local_180._reader.data;
    type_00._reader.pointers = local_180._reader.pointers;
    type_00._reader.dataSize = local_180._reader.dataSize;
    type_00._reader.pointerCount = local_180._reader.pointerCount;
    type_00._reader._38_2_ = local_180._reader._38_2_;
    type_00._reader.nestingLimit = local_180._reader.nestingLimit;
    type_00._reader._44_4_ = local_180._reader._44_4_;
    checkExampleValue(&local_e8,ordinal,type_00,sharedOrdinalCount_00);
    DynamicValue::Reader::~Reader(&local_e8);
    break;
  case 0xf:
    RVar9 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    local_218._reader.segment._0_7_ = RVar9.schema.super_Schema.raw._0_7_;
    local_218._reader.segment._7_1_ = RVar9.schema.super_Schema.raw._7_1_;
    local_218._reader.capTable._0_2_ = RVar9.value;
    DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&f,(DynamicEnum *)&local_218);
    if ((char)f.exception != '\x01') {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x21c,FAILED,"value.as<DynamicEnum>().getEnumerant() != nullptr","");
      kj::_::Debug::Fault::fatal(&f);
    }
    local_218._reader.segment._0_7_ = (undefined7)aStack_268.intValue;
    local_218._reader.segment._7_1_ = (undefined1)((ulong)aStack_268._0_8_ >> 0x38);
    EnumSchema::getEnumerants((EnumerantList *)&f,(EnumSchema *)&local_218);
    if (ordinal % (uint)aStack_268.anyPointerValue.reader.nestingLimit !=
        (uint)aStack_268.enumValue.value) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x21e,FAILED,
                 "enumerant.getIndex() == ordinal % enumerant.getContainingEnum().getEnumerants().size()"
                 ,"");
      kj::_::Debug::Fault::fatal(&f);
    }
    break;
  case 0x10:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&structValue,value);
    structType = structValue.schema;
    name.content.size_ = 2;
    name.content.ptr = "i";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&f,&structType,name);
    if ((char)f.exception == '\x01') {
      local_218._reader._39_1_ = SUB81(aStack_268.listValue.reader.ptr,0);
      local_218._reader._40_7_ = SUB87((ulong)aStack_268._32_8_ >> 8,0);
      local_218._reader._47_1_ = SUB81(aStack_268._40_8_,0);
      uStack_1e8 = (undefined7)((ulong)aStack_268._40_8_ >> 8);
      local_218._reader.data._7_1_ = SUB81(aStack_268.listValue.reader.segment,0);
      local_218._reader.pointers._0_7_ = (undefined7)((ulong)aStack_268._16_8_ >> 8);
      local_218._reader.pointers._7_1_ = (undefined1)aStack_268.anyPointerValue.reader.nestingLimit;
      local_218._reader._32_7_ =
           SUB87(CONCAT44(aStack_268._28_4_,aStack_268.anyPointerValue.reader.nestingLimit) >> 8,0);
      local_218._reader.segment._7_1_ = (undefined1)aStack_268.intValue;
      local_218._reader.capTable._0_2_ = (uint16_t)((ulong)aStack_268._0_8_ >> 8);
      local_218._reader.capTable._2_5_ = (undefined5)((ulong)aStack_268._0_8_ >> 0x18);
      local_218._reader.capTable._7_1_ = (undefined1)aStack_268.enumValue.value;
      local_218._reader.data._0_7_ =
           (undefined7)
           (CONCAT62(aStack_268.textValue.super_StringPtr.content.size_._2_6_,
                     aStack_268.enumValue.value) >> 8);
      field._8_8_ = CONCAT62(aStack_268.textValue.super_StringPtr.content.size_._2_6_,
                             aStack_268.enumValue.value);
      field.parent.super_Schema.raw = (Schema)(Schema)aStack_268.intValue;
      field.proto._reader.segment = aStack_268.listValue.reader.segment;
      field.proto._reader.capTable =
           (CapTableReader *)
           CONCAT44(aStack_268._28_4_,aStack_268.anyPointerValue.reader.nestingLimit);
      field.proto._reader.data = aStack_268.listValue.reader.ptr;
      field.proto._reader.pointers = (WirePointer *)aStack_268._40_8_;
      field.proto._reader._32_8_ = aStack_268._48_8_;
      field.proto._reader._40_8_ = aStack_268._56_8_;
      DynamicStruct::Reader::get((Reader *)&f,&structValue,field);
      uVar6 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if (uVar6 != ordinal) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                   ,0x212,FAILED,"structValue.get(*fieldI).as<uint32_t>() == ordinal","");
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      name_00.content.size_ = 3;
      name_00.content.ptr = "f0";
      StructSchema::getFieldByName((Field *)&f,&structType,name_00);
      field_00.parent.super_Schema.raw._1_7_ = f.exception._1_7_;
      field_00.parent.super_Schema.raw._0_1_ = (char)f.exception;
      field_00.proto._reader.segment._2_6_ =
           aStack_268.textValue.super_StringPtr.content.size_._2_6_;
      field_00.proto._reader.segment._0_2_ = aStack_268.enumValue.value;
      field_00.proto._reader.data._4_4_ = aStack_268._28_4_;
      field_00.proto._reader.data._0_4_ = aStack_268.anyPointerValue.reader.nestingLimit;
      field_00._8_8_ = aStack_268.intValue;
      field_00.proto._reader.capTable = (CapTableReader *)aStack_268.listValue.reader.segment;
      field_00.proto._reader.pointers = (WirePointer *)aStack_268.listValue.reader.ptr;
      field_00.proto._reader._32_8_ = aStack_268._40_8_;
      field_00.proto._reader._40_8_ = aStack_268._48_8_;
      DynamicStruct::Reader::get(&local_a0,&structValue,field_00);
      capnp::schema::Field::Slot::Reader::getType(&local_150,&local_58);
      type_01._reader.capTable = local_150._reader.capTable;
      type_01._reader.segment = local_150._reader.segment;
      type_01._reader.data = local_150._reader.data;
      type_01._reader.pointers = local_150._reader.pointers;
      type_01._reader.dataSize = local_150._reader.dataSize;
      type_01._reader.pointerCount = local_150._reader.pointerCount;
      type_01._reader._38_2_ = local_150._reader._38_2_;
      type_01._reader.nestingLimit = local_150._reader.nestingLimit;
      type_01._reader._44_4_ = local_150._reader._44_4_;
      checkExampleValue(&local_a0,ordinal,type_01,sharedOrdinalCount_01);
      DynamicValue::Reader::~Reader(&local_a0);
    }
  }
  return;
}

Assistant:

void checkExampleValue(DynamicValue::Reader value, uint ordinal, schema::Type::Reader type,
                       uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: KJ_ASSERT(value.as<int32_t>() == ordinal * 47327); break;
    case schema::Type::FLOAT64: KJ_ASSERT(value.as<double>() == ordinal * 313.25); break;
    case schema::Type::INT8: KJ_ASSERT(value.as<int8_t>() == int(ordinal % 256) - 128); break;
    case schema::Type::UINT16: KJ_ASSERT(value.as<uint16_t>() == ordinal * 13); break;
    case schema::Type::BOOL: KJ_ASSERT(value.as<bool>() == (ordinal % 2 == 0)); break;
    case schema::Type::TEXT: KJ_ASSERT(value.as<Text>() == kj::str(ordinal)); break;
    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto structType = structValue.getSchema();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        KJ_ASSERT(structValue.get(*fieldI).as<uint32_t>() == ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        checkExampleValue(structValue.get(field), ordinal,
                          field.getProto().getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto enumerant = KJ_ASSERT_NONNULL(value.as<DynamicEnum>().getEnumerant());
      KJ_ASSERT(enumerant.getIndex() ==
          ordinal % enumerant.getContainingEnum().getEnumerants().size());
      break;
    }
    case schema::Type::LIST:
      checkExampleValue(value.as<DynamicList>()[0], ordinal, type.getList().getElementType(),
                        sharedOrdinalCount);
      break;
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }